

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O2

float linalg::dot<float,4>(vec<float,_4> *a,vec<float,_4> *b)

{
  type tVar1;
  
  tVar1 = detail::apply<linalg::detail::op_mul,void,linalg::vec<float,4>,linalg::vec<float,4>>::
          impl<0,1,2,3>();
  return tVar1.y + tVar1.x + 0.0 + tVar1.z + tVar1.w;
}

Assistant:

constexpr vec<T,3> cross    (const vec<T,3> & a, const vec<T,3> & b)      { return {a.y*b.z-a.z*b.y, a.z*b.x-a.x*b.z, a.x*b.y-a.y*b.x}; }